

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_ineq.h
# Opt level: O3

void __thiscall
mp::
Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>
::ConvertCtxNeg(Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                *this,ItemType *cc,int param_2)

{
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_00;
  double eps;
  PreprocessInfoStd PStack_38;
  
  this_00 = (BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)(this->
               super_BasicFuncConstrCvt<mp::Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ComputeBoundsAndType
            (&PStack_38,this_00,
             &(cc->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
              .args_.super_LinTerms);
  if (PStack_38.type_ == INTEGER) {
    eps = 1.0;
  }
  else {
    eps = *(double *)(this_00 + 0x7e68);
  }
  ConvertCondIneq<1>(this,cc,0,eps);
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& cc, int ) {
    constexpr auto kind_output =               // output comparison is <= or >=
        ( kind_input>0 ) ? -1 : 1;             // even for < or >
    auto eps_output =
        ( kind_input==1 || kind_input==-1 ) ?  // non-strict comparison?
          kind_output *
            GetMC().ComparisonEps(   // 1 for integer expressions
              GetMC().ComputeBoundsAndType(cc.GetArguments()).
              get_result_type() ) :
          0.0;
    ConvertCondIneq<kind_output>(cc, 0, eps_output);
  }